

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int archive_read_support_filter_lzma(archive *_a)

{
  int iVar1;
  archive_read_filter_bidder *paStack_28;
  int magic_test;
  archive_read_filter_bidder *bidder;
  archive_read *a;
  archive *_a_local;
  
  bidder = (archive_read_filter_bidder *)_a;
  a = (archive_read *)_a;
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_filter_lzma");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    iVar1 = __archive_read_get_bidder((archive_read *)bidder,&stack0xffffffffffffffd8);
    if (iVar1 == 0) {
      paStack_28->data = (void *)0x0;
      paStack_28->name = "lzma";
      paStack_28->bid = lzma_bidder_bid;
      paStack_28->init = lzma_bidder_init;
      paStack_28->options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
      paStack_28->free = (_func_int_archive_read_filter_bidder_ptr *)0x0;
      _a_local._4_4_ = 0;
    }
    else {
      _a_local._4_4_ = -0x1e;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_filter_lzma(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *bidder;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_lzma");

	if (__archive_read_get_bidder(a, &bidder) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	bidder->data = NULL;
	bidder->name = "lzma";
	bidder->bid = lzma_bidder_bid;
	bidder->init = lzma_bidder_init;
	bidder->options = NULL;
	bidder->free = NULL;
#if HAVE_LZMA_H && HAVE_LIBLZMA
	return (ARCHIVE_OK);
#elif HAVE_LZMADEC_H && HAVE_LIBLZMADEC
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lzma program for lzma decompression");
	return (ARCHIVE_WARN);
#endif
}